

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_initCStream_srcSize(ZSTD_CStream *zcs,int compressionLevel,unsigned_long_long pss)

{
  uint uVar1;
  unsigned_long_long in_RDX;
  ZSTD_CCtx *in_RDI;
  size_t err_code_3;
  size_t err_code_2;
  size_t err_code_1;
  size_t err_code;
  U64 pledgedSrcSize;
  ZSTD_CCtx *in_stack_ffffffffffffffa8;
  unsigned_long_long uVar2;
  ZSTD_CCtx *in_stack_ffffffffffffffb8;
  size_t local_8;
  
  if (in_RDX == 0) {
    in_RDX = 0xffffffffffffffff;
  }
  uVar2 = in_RDX;
  local_8 = ZSTD_CCtx_reset(in_stack_ffffffffffffffa8,0);
  uVar1 = ERR_isError(local_8);
  if (uVar1 == 0) {
    local_8 = ZSTD_CCtx_refCDict(in_stack_ffffffffffffffa8,(ZSTD_CDict *)0x2a9c00);
    uVar1 = ERR_isError(local_8);
    if (uVar1 == 0) {
      local_8 = ZSTD_CCtx_setParameter
                          (in_stack_ffffffffffffffb8,(ZSTD_cParameter)(uVar2 >> 0x20),(int)uVar2);
      uVar1 = ERR_isError(local_8);
      if (uVar1 == 0) {
        local_8 = ZSTD_CCtx_setPledgedSrcSize(in_RDI,in_RDX);
        uVar1 = ERR_isError(local_8);
        if (uVar1 == 0) {
          local_8 = 0;
        }
      }
    }
  }
  return local_8;
}

Assistant:

size_t ZSTD_initCStream_srcSize(ZSTD_CStream* zcs, int compressionLevel, unsigned long long pss)
{
    /* temporary : 0 interpreted as "unknown" during transition period.
     * Users willing to specify "unknown" **must** use ZSTD_CONTENTSIZE_UNKNOWN.
     * 0 will be interpreted as "empty" in the future.
     */
    U64 const pledgedSrcSize = (pss==0) ? ZSTD_CONTENTSIZE_UNKNOWN : pss;
    DEBUGLOG(4, "ZSTD_initCStream_srcSize");
    FORWARD_IF_ERROR( ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only) , "");
    FORWARD_IF_ERROR( ZSTD_CCtx_refCDict(zcs, NULL) , "");
    FORWARD_IF_ERROR( ZSTD_CCtx_setParameter(zcs, ZSTD_c_compressionLevel, compressionLevel) , "");
    FORWARD_IF_ERROR( ZSTD_CCtx_setPledgedSrcSize(zcs, pledgedSrcSize) , "");
    return 0;
}